

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::evaluateHierarchicalFunctionsGPU
          (GridLocalPolynomial *this,float *gpu_x,int cpu_num_x,float *gpu_y)

{
  int iVar1;
  int iVar2;
  AccelerationContext *pAVar3;
  TypeOneDRule TVar4;
  int iVar5;
  pointer pCVar6;
  float *pfVar7;
  float *pfVar8;
  float *gpu_y_local;
  int cpu_num_x_local;
  float *gpu_x_local;
  GridLocalPolynomial *this_local;
  
  loadGpuBasis<float>(this);
  pAVar3 = (this->super_BaseCanonicalGrid).acceleration;
  iVar1 = this->order;
  TVar4 = RuleLocal::getRule(this->effective_rule);
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  iVar5 = BaseCanonicalGrid::getNumPoints(&this->super_BaseCanonicalGrid);
  pCVar6 = std::
           unique_ptr<TasGrid::CudaLocalPolynomialData<float>,_std::default_delete<TasGrid::CudaLocalPolynomialData<float>_>_>
           ::operator->(&this->gpu_cachef);
  pfVar7 = GpuVector<float>::data(&pCVar6->nodes);
  pCVar6 = std::
           unique_ptr<TasGrid::CudaLocalPolynomialData<float>,_std::default_delete<TasGrid::CudaLocalPolynomialData<float>_>_>
           ::operator->(&this->gpu_cachef);
  pfVar8 = GpuVector<float>::data(&pCVar6->support);
  TasGpu::devalpwpoly<float>(pAVar3,iVar1,TVar4,iVar2,cpu_num_x,iVar5,gpu_x,pfVar7,pfVar8,gpu_y);
  return;
}

Assistant:

void GridLocalPolynomial::evaluateHierarchicalFunctionsGPU(const float gpu_x[], int cpu_num_x, float *gpu_y) const{
    loadGpuBasis<float>();
    TasGpu::devalpwpoly(acceleration, order, RuleLocal::getRule(effective_rule), num_dimensions, cpu_num_x, getNumPoints(), gpu_x, gpu_cachef->nodes.data(), gpu_cachef->support.data(), gpu_y);
}